

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::detail::dtoa_impl::append_exponent(char *buf,int e)

{
  uint32_t k;
  int e_local;
  char *buf_local;
  
  if (e < 0) {
    e_local = -e;
    *buf = '-';
  }
  else {
    *buf = '+';
    e_local = e;
  }
  buf_local = buf + 1;
  if ((uint)e_local < 10) {
    *buf_local = '0';
    buf_local = buf + 3;
    buf[2] = (char)e_local + '0';
  }
  else if ((uint)e_local < 100) {
    *buf_local = (char)((ulong)(uint)e_local / 10) + '0';
    buf_local = buf + 3;
    buf[2] = (char)((uint)e_local % 10) + '0';
  }
  else {
    *buf_local = (char)((ulong)(uint)e_local / 100) + '0';
    buf[2] = (char)(((uint)e_local % 100) / 10) + '0';
    buf_local = buf + 4;
    buf[3] = (char)(((uint)e_local % 100) % 10) + '0';
  }
  return buf_local;
}

Assistant:

inline char* append_exponent(char* buf, int e)
{
    assert(e > -1000);
    assert(e <  1000);

    if (e < 0)
    {
        e = -e;
        *buf++ = '-';
    }
    else
    {
        *buf++ = '+';
    }

    uint32_t k = static_cast<uint32_t>(e);
    if (k < 10)
    {
        // Always print at least two digits in the exponent.
        // This is for compatibility with printf("%g").
        *buf++ = '0';
        *buf++ = static_cast<char>('0' + k);
    }
    else if (k < 100)
    {
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }
    else
    {
        *buf++ = static_cast<char>('0' + k / 100);
        k %= 100;
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }

    return buf;
}